

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O2

bool __thiscall CsvModelSerialiser::saveModel(CsvModelSerialiser *this,QIODevice *destination)

{
  CsvModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QTextStream writer;
  
  if (((destination != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)destination + 0x68))(destination,0x12), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isWritable(), cVar1 != '\0')))) &&
     (this_00 = (CsvModelSerialiserPrivate *)
                (this->super_AbstractSingleRoleSerialiser).super_AbstractStringSerialiser.
                super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
     super_AbstractModelSerialiserPrivate.m_constModel != (QAbstractItemModel *)0x0)) {
    QIODevice::setTextModeEnabled(SUB81(destination,0));
    QTextStream::QTextStream(&writer,destination);
    bVar2 = CsvModelSerialiserPrivate::writeCsv(this_00,&writer);
    QTextStream::~QTextStream(&writer);
    return bVar2;
  }
  return false;
}

Assistant:

bool CsvModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly | QIODevice::Text))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const CsvModelSerialiser);

    if (!d->m_constModel)
        return false;
    destination->setTextModeEnabled(true);
    QTextStream writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeCsv(writer);
}